

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O3

TypeDef __thiscall winmd::reader::cache::find_required(cache *this,string_view *type_string)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  row_base<winmd::reader::TypeDef> rVar6;
  string local_58;
  string_view local_38;
  string_view local_28;
  
  uVar2 = type_string->_M_len;
  if (uVar2 != 0) {
    local_28._M_str = type_string->_M_str;
    uVar4 = 0xffffffffffffffff;
    lVar5 = 0;
    while (uVar2 + lVar5 != 0) {
      uVar4 = uVar4 + 1;
      lVar1 = lVar5 + -1;
      lVar3 = lVar5 + (uVar2 - 1);
      lVar5 = lVar1;
      if (local_28._M_str[lVar3] == '.') {
        local_28._M_len = lVar1 + uVar2;
        local_38._M_len = uVar2;
        if (uVar4 < uVar2) {
          local_38._M_len = uVar4;
        }
        local_38._M_str = local_28._M_str + (uVar2 - uVar4);
        rVar6 = (row_base<winmd::reader::TypeDef>)find_required(this,&local_28,&local_38);
        return (TypeDef)rVar6;
      }
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Type \'","");
  impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[35]>
            (&local_58,type_string,(char (*) [35])"\' is missing a namespace qualifier");
}

Assistant:

TypeDef find_required(std::string_view const& type_string) const
        {
            auto pos = type_string.rfind('.');

            if (pos == std::string_view::npos)
            {
                impl::throw_invalid("Type '", type_string, "' is missing a namespace qualifier");
            }

            return find_required(type_string.substr(0, pos), type_string.substr(pos + 1, type_string.size()));
        }